

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStridingMeshInterface.cpp
# Opt level: O0

void __thiscall
btStridingMeshInterface::calculateAabbBruteForce
          (btStridingMeshInterface *this,btVector3 *aabbMin,btVector3 *aabbMax)

{
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  long *in_RDI;
  AabbCalculationCallback aabbCallback;
  btScalar local_68;
  btScalar local_64;
  btScalar local_60 [4];
  undefined4 in_stack_ffffffffffffffb0;
  btScalar in_stack_ffffffffffffffb4;
  btScalar local_48;
  btScalar local_44;
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  btVector3 *local_18;
  btVector3 *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  calculateAabbBruteForce::AabbCalculationCallback::AabbCalculationCallback
            ((AabbCalculationCallback *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_44 = -1e+18;
  local_48 = -1e+18;
  btVector3::setValue(local_10,&local_44,&local_48,(btScalar *)&stack0xffffffffffffffb4);
  local_60[0] = 1e+18;
  local_64 = 1e+18;
  local_68 = 1e+18;
  btVector3::setValue(local_18,local_60,&local_64,&local_68);
  (**(code **)(*in_RDI + 0x10))(in_RDI,local_40,local_10,local_18);
  *(undefined8 *)local_10->m_floats = local_38;
  *(undefined8 *)(local_10->m_floats + 2) = local_30;
  *(undefined8 *)local_18->m_floats = local_28;
  *(undefined8 *)(local_18->m_floats + 2) = local_20;
  calculateAabbBruteForce::AabbCalculationCallback::~AabbCalculationCallback
            ((AabbCalculationCallback *)0x1c6bf2);
  return;
}

Assistant:

void	btStridingMeshInterface::calculateAabbBruteForce(btVector3& aabbMin,btVector3& aabbMax)
{

	struct	AabbCalculationCallback : public btInternalTriangleIndexCallback
	{
		btVector3	m_aabbMin;
		btVector3	m_aabbMax;

		AabbCalculationCallback()
		{
			m_aabbMin.setValue(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
			m_aabbMax.setValue(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
		}

		virtual void internalProcessTriangleIndex(btVector3* triangle,int partId,int  triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;

			m_aabbMin.setMin(triangle[0]);
			m_aabbMax.setMax(triangle[0]);
			m_aabbMin.setMin(triangle[1]);
			m_aabbMax.setMax(triangle[1]);
			m_aabbMin.setMin(triangle[2]);
			m_aabbMax.setMax(triangle[2]);
		}
	};

	//first calculate the total aabb for all triangles
	AabbCalculationCallback	aabbCallback;
	aabbMin.setValue(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
	aabbMax.setValue(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
	InternalProcessAllTriangles(&aabbCallback,aabbMin,aabbMax);

	aabbMin = aabbCallback.m_aabbMin;
	aabbMax = aabbCallback.m_aabbMax;
}